

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakefilegenerator.cpp
# Opt level: O2

string * __thiscall
CMakeFileGenerator::generateCode_abi_cxx11_(string *__return_storage_ptr__,CMakeFileGenerator *this)

{
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  __rhs = &this->cpp_file_name;
  std::operator+(&local_50,"add_executable(",__rhs);
  std::operator+(&local_30,&local_50," ");
  std::operator+(&local_90,&local_30,__rhs);
  std::operator+(&local_70,&local_90,".cpp)\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::operator+(&local_90,"target_link_libraries(",__rhs);
  std::operator+(&local_70,&local_90," ${YARP_LIBRARIES})\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string CMakeFileGenerator::generateCode() {
  std::string code;

  //code += "    outputPort.write(bottleToSend);\n";
  code += "cmake_minimum_required(VERSION 2.8.7)\n";
  code += "# find YARP\n";
  code += "find_package(YARP REQUIRED)\n";
  code += "\n";
  code += "# add YARP include directories\n";
  code += "include_directories(${YARP_INCLUDE_DIRS})\n";
  code += "include_directories(${CMAKE_CURRENT_SOURCE_DIR})\n";
  code += "\n";
  code += "# set up our program\n";
  code += "add_executable(" + cpp_file_name + " " + cpp_file_name + ".cpp)\n";
  code += "\n";
  code += "# link with YARP libraries\n";
  code += "target_link_libraries(" + cpp_file_name +" ${YARP_LIBRARIES})\n";
  return code;
}